

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessOpDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  string *this_00;
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  undefined8 uVar4;
  string *psVar5;
  string *psVar6;
  pointer puVar7;
  Status SVar8;
  int iVar9;
  char *pcVar10;
  Value *pVVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Timestamp *extraout_RDX;
  Timestamp *extraout_RDX_00;
  Timestamp *extraout_RDX_01;
  Timestamp *extraout_RDX_02;
  Timestamp *aTimestamp;
  Channel *extraout_RDX_03;
  Channel *extraout_RDX_04;
  Channel *extraout_RDX_05;
  Channel *extraout_RDX_06;
  Channel *aChannel;
  ChannelMask *extraout_RDX_07;
  ChannelMask *extraout_RDX_08;
  ChannelMask *extraout_RDX_09;
  ChannelMask *extraout_RDX_10;
  ChannelMask *aChannelMask;
  ByteArray *extraout_RDX_11;
  ByteArray *extraout_RDX_12;
  ByteArray *extraout_RDX_13;
  ByteArray *extraout_RDX_14;
  ByteArray *extraout_RDX_15;
  ByteArray *extraout_RDX_16;
  SecurityPolicy *extraout_RDX_17;
  SecurityPolicy *extraout_RDX_18;
  SecurityPolicy *aSecurityPolicy;
  ActiveOperationalDataset *extraout_RDX_19;
  ActiveOperationalDataset *extraout_RDX_20;
  ActiveOperationalDataset *aDataset;
  PendingOperationalDataset *extraout_RDX_21;
  PendingOperationalDataset *extraout_RDX_22;
  PendingOperationalDataset *aDataset_00;
  ByteArray *extraout_RDX_23;
  ByteArray *extraout_RDX_24;
  ByteArray *pBVar14;
  undefined1 auVar15 [8];
  char *pcVar16;
  undefined1 *puVar17;
  _Alloc_hider _Var18;
  undefined1 auVar19 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  undefined1 *puVar21;
  size_t sVar22;
  undefined4 uVar23;
  undefined8 unaff_R15;
  undefined7 uVar24;
  bool bVar25;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  initializer_list<unsigned_char> __l;
  ByteArray xpanid;
  ChannelMask channelMask;
  ActiveOperationalDataset dataset;
  Timestamp activeTimestamp;
  uint32_t delay;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  StringArray unresolved;
  undefined1 local_c08 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf8;
  undefined4 local_be4;
  CommissionerAppPtr *local_be0;
  undefined1 local_bd8 [8];
  undefined1 auStack_bd0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bc0;
  _Alloc_hider local_bb0;
  undefined8 local_ba8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba0 [2];
  uint local_b80;
  undefined1 local_b78 [8];
  _Alloc_hider local_b70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b68;
  undefined2 local_b58;
  value_type local_b50 [2];
  pointer local_b10;
  pointer local_b08;
  uint16_t local_ac8;
  pointer local_ac0;
  pointer local_ab8;
  uint local_aa8;
  string *local_a98;
  string *local_a90;
  undefined1 local_a88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a48;
  Interpreter *local_a28;
  undefined4 local_a20;
  pointer local_a18;
  element_type *local_a10;
  undefined1 local_a08 [16];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_9f8;
  StringArray local_9d8;
  undefined4 local_9c0;
  undefined1 *local_9b8;
  long local_9b0;
  undefined1 local_9a8 [16];
  undefined4 local_998;
  undefined1 *local_990;
  long local_988;
  undefined1 local_980 [16];
  undefined4 local_970;
  undefined1 *local_968;
  long local_960;
  undefined1 local_958 [16];
  undefined4 local_948;
  undefined1 *local_940;
  long local_938;
  undefined1 local_930 [16];
  undefined4 local_920;
  undefined1 *local_918;
  long local_910;
  undefined1 local_908 [16];
  undefined4 local_8f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8f0;
  long local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  undefined4 local_8d0;
  undefined1 *local_8c8;
  long local_8c0;
  undefined1 local_8b8 [16];
  undefined4 local_8a8;
  undefined1 *local_8a0;
  long local_898;
  undefined1 local_890 [16];
  undefined4 local_880;
  undefined1 *local_878;
  long local_870;
  undefined1 local_868 [16];
  undefined4 local_858;
  undefined1 *local_850;
  long local_848;
  undefined1 local_840 [16];
  undefined4 local_830;
  undefined1 *local_828;
  long local_820;
  undefined1 local_818 [16];
  undefined4 local_808;
  undefined1 *local_800;
  long local_7f8;
  undefined1 local_7f0 [16];
  undefined4 local_7e0;
  undefined1 *local_7d8;
  long local_7d0;
  undefined1 local_7c8 [16];
  string local_7b8;
  string local_798;
  type local_778 [2] [1];
  undefined1 *local_770;
  long local_768;
  undefined1 local_760 [16];
  type local_750 [2] [1];
  long local_748;
  long local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  Error local_728;
  type local_700 [2] [1];
  undefined1 *local_6f8;
  long local_6f0;
  undefined1 local_6e8 [16];
  type local_6d8 [2] [1];
  undefined1 *local_6d0;
  long local_6c8;
  undefined1 local_6c0 [16];
  Error local_6b0;
  undefined4 local_688 [2];
  undefined1 *local_680;
  long local_678;
  undefined1 local_670 [16];
  undefined4 local_660 [2];
  long local_658;
  long local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  Error local_638;
  Error local_610;
  undefined4 local_5e8 [2];
  undefined1 *local_5e0;
  long local_5d8;
  undefined1 local_5d0 [16];
  undefined4 local_5c0 [2];
  long local_5b8;
  long local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  Error local_598;
  undefined4 local_570 [2];
  undefined1 *local_568;
  long local_560;
  undefined1 local_558 [16];
  undefined4 local_548 [2];
  long local_540;
  long local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  Error local_520;
  Error local_4f8;
  undefined4 local_4d0 [2];
  undefined1 *local_4c8;
  long local_4c0;
  undefined1 local_4b8 [16];
  undefined4 local_4a8 [2];
  long local_4a0;
  long local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined4 local_480 [2];
  undefined1 *local_478;
  long local_470;
  undefined1 local_468 [16];
  undefined4 local_458 [2];
  long local_450;
  long local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  Error local_430;
  Error local_408;
  undefined4 local_3e0 [2];
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  undefined4 local_3b8 [2];
  long local_3b0;
  long local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  Error local_390;
  undefined4 local_368 [2];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined4 local_340 [2];
  long local_338;
  long local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  Error local_318;
  undefined4 local_2f0 [2];
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined4 local_2c8 [2];
  long local_2c0;
  long local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  Error local_2a0;
  undefined4 local_278 [2];
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined4 local_250 [2];
  long local_248;
  long local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Error local_228;
  Error local_200;
  Error local_1d8;
  undefined4 local_1b0 [2];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  allocator_type local_188 [8];
  pointer pbStack_180;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_bd8 = (undefined1  [8])((ulong)local_bd8 & 0xffffffff00000000);
    auStack_bd0._0_8_ = "too few arguments";
    auStack_bd0._8_8_ = 0x11;
    local_bc0._0_8_ = 0;
    local_bb0._M_p = (pointer)0x0;
    pcVar16 = "too few arguments";
    local_bc0._8_8_ = (format_string_checker<char> *)local_bd8;
    do {
      pcVar10 = pcVar16 + 1;
      if (*pcVar16 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar16 + 2;
      }
      else if (*pcVar16 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar16,"",(format_string_checker<char> *)local_bd8);
      }
      pcVar16 = pcVar10;
    } while (pcVar10 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_bd8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_a20 = 2;
    local_a18 = (pointer)local_a08;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a18,local_c08._0_8_,(byte *)(local_c08._8_8_ + local_c08._0_8_));
    local_b78._0_4_ = local_a20;
    local_b70._M_p = local_b68._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b70,local_a18,
               (undefined1 *)
               ((long)&(local_a10->mJobPool).
                       super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)local_a18));
    local_b50[0]._M_string_length = 0;
    local_b50[0].field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
    local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_b70);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)local_b50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b50[0]._M_dataplus._M_p != &local_b50[0].field_2) {
      operator_delete(local_b50[0]._M_dataplus._M_p);
    }
    if (local_b70._M_p != local_b68._M_local_buf + 8) {
      operator_delete(local_b70._M_p);
    }
    if (local_a18 != (pointer)local_a08) {
      operator_delete(local_a18);
    }
    paVar13 = &local_bf8;
    goto LAB_0012b26b;
  }
  paVar13 = &local_bf8;
  local_c08._0_8_ = paVar13;
  local_be0 = aCommissioner;
  local_a98 = (string *)this_00;
  local_a90 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"get","");
  utils::ToLower((string *)local_b78,pbVar2 + 1);
  utils::ToLower((string *)local_bd8,(string *)local_c08);
  auVar15 = local_bd8;
  local_a28 = this;
  if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
    uVar24 = (undefined7)((ulong)unaff_R15 >> 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b70._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar23 = (undefined4)CONCAT71(uVar24,1);
    }
    else {
      iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
      uVar23 = (undefined4)CONCAT71(uVar24,iVar9 == 0);
    }
  }
  else {
    uVar23 = 0;
  }
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_bd0 + 8);
  if (auVar15 != (undefined1  [8])paVar20) {
    operator_delete((void *)auVar15);
  }
  if (local_b78 != (undefined1  [8])&local_b68) {
    operator_delete((void *)local_b78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._0_8_ != paVar13) {
    operator_delete((void *)local_c08._0_8_);
  }
  local_be4 = uVar23;
  if ((char)uVar23 == '\0') {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"set","");
    utils::ToLower((string *)local_b78,pbVar2 + 1);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    if (auVar15 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (bVar25) goto LAB_0012b391;
    local_bd8._0_4_ = 0xd;
    auStack_bd0._0_8_ = "\'{}\' is not a valid sub-command";
    auStack_bd0._8_8_ = 0x1f;
    local_bc0._0_8_ = 0x100000000;
    local_bb0._M_p =
         (pointer)::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar16 = "\'{}\' is not a valid sub-command";
    local_bc0._8_8_ = (format_string_checker<char> *)local_bd8;
    do {
      pcVar10 = pcVar16 + 1;
      if (*pcVar16 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar16 + 2;
      }
      else if (*pcVar16 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                            (pcVar16,"",(format_string_checker<char> *)local_bd8);
      }
      pcVar16 = pcVar10;
    } while (pcVar10 != "");
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_bd8 = (undefined1  [8])pbVar2[1]._M_dataplus._M_p;
    auStack_bd0._0_8_ = pbVar2[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_bd8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_c08,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
    local_7e0 = 3;
    puVar21 = local_7c8;
    local_7d8 = puVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7d8,local_c08._0_8_,(byte *)(local_c08._8_8_ + local_c08._0_8_));
    local_b78._0_4_ = local_7e0;
    local_b70._M_p = local_b68._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b70,local_7d8,local_7d8 + local_7d0);
    local_b50[0]._M_string_length = 0;
    local_b50[0].field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
    local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
    std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
    std::__cxx11::string::operator=(local_a90,(string *)local_b50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b50[0]._M_dataplus._M_p != &local_b50[0].field_2) {
      operator_delete(local_b50[0]._M_dataplus._M_p);
    }
    puVar17 = local_7d8;
    if (local_b70._M_p != local_b68._M_local_buf + 8) {
      operator_delete(local_b70._M_p);
      puVar17 = local_7d8;
    }
LAB_0012b966:
    auVar15 = (undefined1  [8])local_c08._0_8_;
    if (puVar17 != puVar21) {
      operator_delete(puVar17);
      auVar15 = (undefined1  [8])local_c08._0_8_;
    }
  }
  else {
LAB_0012b391:
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"activetimestamp","");
    utils::ToLower((string *)local_b78,pbVar2 + 2);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    if (auVar15 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (bVar25) {
      if ((char)local_be4 != '\0') {
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1d])
                  (local_1b0,peVar3,local_a88);
        local_b78._0_4_ = local_1b0[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_1a8,local_1a8 + local_1a0);
        psVar6 = local_a90;
        psVar5 = local_a98;
        paVar13 = &local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar6,(string *)local_b50);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        aTimestamp = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
          aTimestamp = extraout_RDX_00;
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
          aTimestamp = extraout_RDX_01;
        }
        if (local_1a8 != local_198) {
          operator_delete(local_1a8);
          aTimestamp = extraout_RDX_02;
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        ToString_abi_cxx11_(&local_50,(Interpreter *)local_a88,aTimestamp);
        Value::Value((Value *)local_b78,&local_50);
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        std::__cxx11::string::operator=(psVar5,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar6,(string *)local_b50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
        }
        paVar13 = &local_50.field_2;
LAB_0012b26b:
        auVar15 = (undefined1  [8])
                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(paVar13->_M_local_buf + -0x10);
LAB_0012b26f:
        if (auVar15 == (undefined1  [8])paVar13) {
          return __return_storage_ptr__;
        }
        goto LAB_0012b97a;
      }
      local_bd8 = (undefined1  [8])((ulong)local_bd8 & 0xffffffff00000000);
      auStack_bd0._0_8_ = "cannot set activetimestamp";
      auStack_bd0._8_8_ = 0x1a;
      local_bc0._0_8_ = 0;
      local_bb0._M_p = (pointer)0x0;
      pcVar16 = "cannot set activetimestamp";
      local_bc0._8_8_ = (format_string_checker<char> *)local_bd8;
      do {
        pcVar10 = pcVar16 + 1;
        if (*pcVar16 == '}') {
          if ((pcVar10 == "") || (*pcVar10 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar10 = pcVar16 + 2;
        }
        else if (*pcVar16 == '{') {
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar16,"",(format_string_checker<char> *)local_bd8);
        }
        pcVar16 = pcVar10;
      } while (pcVar10 != "");
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_bd8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_c08,(v10 *)"cannot set activetimestamp",(string_view)ZEXT816(0x1a),
                 args_01);
      local_808 = 2;
      puVar21 = local_7f0;
      local_800 = puVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_800,local_c08._0_8_,(byte *)(local_c08._8_8_ + local_c08._0_8_));
      local_b78._0_4_ = local_808;
      local_b70._M_p = local_b68._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b70,local_800,local_800 + local_7f8);
      local_b50[0]._M_string_length = 0;
      local_b50[0].field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
      local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
      std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
      std::__cxx11::string::operator=(local_a90,(string *)local_b50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50[0]._M_dataplus._M_p != &local_b50[0].field_2) {
        operator_delete(local_b50[0]._M_dataplus._M_p);
      }
      puVar17 = local_800;
      if (local_b70._M_p != local_b68._M_local_buf + 8) {
        operator_delete(local_b70._M_p);
        puVar17 = local_800;
      }
      goto LAB_0012b966;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"channel","");
    utils::ToLower((string *)local_b78,pbVar2 + 2);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    if (auVar15 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (bVar25) {
      if ((char)local_be4 == '\0') {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0xa1) {
          local_bd8 = (undefined1  [8])((ulong)local_bd8 & 0xffffffff00000000);
          auStack_bd0._0_8_ = "too few arguments";
          auStack_bd0._8_8_ = 0x11;
          local_bc0._0_8_ = 0;
          local_bb0._M_p = (pointer)0x0;
          pcVar16 = "too few arguments";
          local_bc0._8_8_ = (format_string_checker<char> *)local_bd8;
          do {
            pcVar10 = pcVar16 + 1;
            if (*pcVar16 == '}') {
              if ((pcVar10 == "") || (*pcVar10 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar10 = pcVar16 + 2;
            }
            else if (*pcVar16 == '{') {
              pcVar10 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar16,"",(format_string_checker<char> *)local_bd8);
            }
            pcVar16 = pcVar10;
          } while (pcVar10 != "");
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)local_bd8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                     args_02);
          local_830 = 2;
          puVar21 = local_818;
          local_828 = puVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_828,local_c08._0_8_,
                     (byte *)(local_c08._8_8_ + local_c08._0_8_));
          local_b78._0_4_ = local_830;
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_828,local_828 + local_820);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
          std::__cxx11::string::operator=(local_a90,(string *)local_b50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b50[0]._M_dataplus._M_p != &local_b50[0].field_2) {
            operator_delete(local_b50[0]._M_dataplus._M_p);
          }
          puVar17 = local_828;
          if (local_b70._M_p != local_b68._M_local_buf + 8) {
            operator_delete(local_b70._M_p);
            puVar17 = local_828;
          }
          goto LAB_0012b966;
        }
        utils::ParseInteger<unsigned_char>(&local_1d8,local_a88,pbVar2 + 3);
        local_b78._0_4_ = local_1d8.mCode;
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_1d8.mMessage._M_dataplus._M_p,
                   local_1d8.mMessage._M_dataplus._M_p + local_1d8.mMessage._M_string_length);
        psVar5 = local_a90;
        paVar13 = &local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar5,(string *)local_b50);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
        }
        pcVar16 = local_b68._M_local_buf + 8;
        if (local_b70._M_p != pcVar16) {
          operator_delete(local_b70._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.mMessage._M_dataplus._M_p != &local_1d8.mMessage.field_2) {
          operator_delete(local_1d8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        utils::ParseInteger<unsigned_short>
                  (&local_200,(unsigned_short *)(local_a88 + 2),
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
        local_b78._0_4_ = local_200.mCode;
        local_b70._M_p = pcVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_200.mMessage._M_dataplus._M_p,
                   local_200.mMessage._M_dataplus._M_p + local_200.mMessage._M_string_length);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        EVar1 = (pVVar11->mError).mCode;
        Value::~Value((Value *)local_b78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200.mMessage._M_dataplus._M_p != &local_200.mMessage.field_2) {
          operator_delete(local_200.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        utils::ParseInteger<unsigned_int>
                  (&local_228,(uint *)&local_a68,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5);
        local_b78._0_4_ = local_228.mCode;
        local_b70._M_p = pcVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_228.mMessage._M_dataplus._M_p,
                   local_228.mMessage._M_dataplus._M_p + local_228.mMessage._M_string_length);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        EVar1 = (pVVar11->mError).mCode;
        Value::~Value((Value *)local_b78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.mMessage._M_dataplus._M_p != &local_228.mMessage.field_2) {
          operator_delete(local_228.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1f])
                  (local_250,peVar3,local_a88,
                   (ulong)local_a68.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
        local_b78._0_4_ = local_250[0];
        local_b70._M_p = pcVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_248,local_240 + local_248);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        paVar13 = &local_238;
      }
      else {
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1e])
                  (local_278,peVar3,local_a88);
        local_b78._0_4_ = local_278[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_270,local_270 + local_268);
        psVar6 = local_a90;
        psVar5 = local_a98;
        paVar13 = &local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar6,(string *)local_b50);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        aChannel = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
          aChannel = extraout_RDX_04;
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
          aChannel = extraout_RDX_05;
        }
        if (local_270 != local_260) {
          operator_delete(local_270);
          aChannel = extraout_RDX_06;
        }
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        ToString_abi_cxx11_(&local_70,(Interpreter *)local_a88,aChannel);
        Value::Value((Value *)local_b78,&local_70);
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        std::__cxx11::string::operator=(psVar5,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar6,(string *)local_b50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
        }
        paVar13 = &local_70.field_2;
      }
      goto LAB_0012b26b;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"channelmask","");
    uVar23 = local_be4;
    utils::ToLower((string *)local_b78,pbVar2 + 2);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    if (auVar15 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (bVar25) {
      local_bd8 = (undefined1  [8])0x0;
      auStack_bd0._0_8_ = (pointer)0x0;
      auStack_bd0._8_8_ = 0;
      if ((char)uVar23 == '\0') {
        ParseChannelMask(&local_2a0,(ChannelMask *)local_bd8,aExpr,3);
        psVar5 = local_a90;
        local_b78._0_4_ = local_2a0.mCode;
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_2a0.mMessage._M_dataplus._M_p,
                   local_2a0.mMessage._M_dataplus._M_p + local_2a0.mMessage._M_string_length);
        paVar13 = &local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar5,(string *)local_b50);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.mMessage._M_dataplus._M_p != &local_2a0.mMessage.field_2) {
          operator_delete(local_2a0.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_0012c3c6;
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x21])
                  (local_2c8,peVar3,local_bd8);
        local_b78._0_4_ = local_2c8[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_2c0,local_2b8 + local_2c0);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        paVar13 = &local_2b0;
      }
      else {
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x20])
                  (local_2f0,peVar3,local_bd8);
        psVar5 = local_a90;
        local_b78._0_4_ = local_2f0[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_2e8,local_2e8 + local_2e0);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_b78._0_4_;
        local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
        std::__cxx11::string::operator=(local_a98,(string *)&local_b70);
        std::__cxx11::string::operator=(psVar5,(string *)local_b50);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        aChannelMask = extraout_RDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b50[0]._M_dataplus._M_p != &local_b50[0].field_2) {
          operator_delete(local_b50[0]._M_dataplus._M_p);
          aChannelMask = extraout_RDX_08;
        }
        if (local_b70._M_p != local_b68._M_local_buf + 8) {
          operator_delete(local_b70._M_p);
          aChannelMask = extraout_RDX_09;
        }
        if (local_2e8 != local_2d8) {
          operator_delete(local_2e8);
          aChannelMask = extraout_RDX_10;
        }
        if (EVar1 != kNone) goto LAB_0012c3c6;
        ToString_abi_cxx11_(&local_90,(Interpreter *)local_bd8,aChannelMask);
        Value::Value((Value *)local_b78,&local_90);
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        paVar13 = &local_90.field_2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar13->_M_local_buf + -0x10) != paVar13) {
        operator_delete(*(undefined1 **)(paVar13->_M_local_buf + -0x10));
      }
LAB_0012c3c6:
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                 *)local_bd8);
      return __return_storage_ptr__;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"xpanid","");
    utils::ToLower((string *)local_b78,pbVar2 + 2);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    if (auVar15 != (undefined1  [8])(auStack_bd0 + 8)) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (bVar25) {
      local_c08._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_c08._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_bf8._M_allocated_capacity = 0;
      if ((char)uVar23 == '\0') {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)local_a88;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_bd8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                     args_03);
          local_858 = 2;
          puVar21 = local_840;
          local_850 = puVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_850,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8));
          local_b78._0_4_ = local_858;
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_850,local_850 + local_848);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          puVar17 = local_850;
LAB_0012c7d4:
          if (puVar17 != puVar21) {
            operator_delete(puVar17);
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          auVar19 = local_bd8;
          if (local_bd8 != (undefined1  [8])(auStack_bd0 + 8)) goto LAB_0012cae4;
        }
        else {
          utils::Hex(&local_318,(ByteArray *)local_c08,pbVar2 + 3);
          local_b78._0_4_ = local_318.mCode;
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_318.mMessage._M_dataplus._M_p,
                     local_318.mMessage._M_dataplus._M_p + local_318.mMessage._M_string_length);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318.mMessage._M_dataplus._M_p != &local_318.mMessage.field_2) {
            operator_delete(local_318.mMessage._M_dataplus._M_p);
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          if (EVar1 == kNone) {
            peVar3 = (local_be0->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x23])
                      (local_340,peVar3,local_c08);
            local_b78._0_4_ = local_340[0];
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_338,local_330 + local_338);
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar13 = &local_328;
            goto LAB_0012cadb;
          }
        }
      }
      else {
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x22])
                  (local_368,peVar3,local_c08);
        local_b78._0_4_ = local_368[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_360,local_360 + local_358);
        local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        EVar1 = (pVVar11->mError).mCode;
        Value::~Value((Value *)local_b78);
        pBVar14 = extraout_RDX_11;
        if (local_360 != local_350) {
          operator_delete(local_360);
          pBVar14 = extraout_RDX_12;
        }
        auVar15 = (undefined1  [8])local_c08._0_8_;
        if (EVar1 == kNone) {
          utils::Hex_abi_cxx11_(&local_b0,(utils *)local_c08,pBVar14);
          Value::Value((Value *)local_b78,&local_b0);
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          paVar13 = &local_b0.field_2;
LAB_0012cadb:
          auVar15 = (undefined1  [8])local_c08._0_8_;
          auVar19 = (undefined1  [8])
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(paVar13->_M_local_buf + -0x10);
          if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(paVar13->_M_local_buf + -0x10) != paVar13) {
LAB_0012cae4:
            operator_delete((void *)auVar19);
            auVar15 = (undefined1  [8])local_c08._0_8_;
          }
        }
      }
      goto LAB_0012caee;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c08._0_8_ = paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"meshlocalprefix","");
    utils::ToLower((string *)local_b78,pbVar2 + 2);
    utils::ToLower((string *)local_bd8,(string *)local_c08);
    auVar15 = local_bd8;
    if (local_b70._M_p == (pointer)auStack_bd0._0_8_) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar25 = true;
      }
      else {
        iVar9 = bcmp((void *)local_b78,(void *)local_bd8,(size_t)local_b70._M_p);
        bVar25 = iVar9 == 0;
      }
    }
    else {
      bVar25 = false;
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(auStack_bd0 + 8);
    if (auVar15 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar15);
    }
    if (local_b78 != (undefined1  [8])&local_b68) {
      operator_delete((void *)local_b78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._0_8_ != paVar13) {
      operator_delete((void *)local_c08._0_8_);
    }
    if (!bVar25) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b78 = (undefined1  [8])&local_b68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"networkmasterkey","");
      bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
      if (local_b78 != (undefined1  [8])&local_b68) {
        operator_delete((void *)local_b78);
      }
      if (bVar25) {
        local_c08._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_c08._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_bf8._M_allocated_capacity = 0;
        if ((char)local_be4 == '\0') {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)local_a88;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_bd8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_05);
            local_8a8 = 2;
            puVar21 = local_890;
            local_8a0 = puVar21;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_8a0,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8))
            ;
            local_b78._0_4_ = local_8a8;
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_8a0,local_8a0 + local_898);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            puVar17 = local_8a0;
            goto LAB_0012c7d4;
          }
          utils::Hex(&local_408,(ByteArray *)local_c08,pbVar2 + 3);
          local_b78._0_4_ = local_408.mCode;
          pcVar16 = local_b68._M_local_buf + 8;
          local_b70._M_p = pcVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_408.mMessage._M_dataplus._M_p,
                     local_408.mMessage._M_dataplus._M_p + local_408.mMessage._M_string_length);
          paVar13 = &local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408.mMessage._M_dataplus._M_p != &local_408.mMessage.field_2) {
            operator_delete(local_408.mMessage._M_dataplus._M_p);
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          if (EVar1 == kNone) {
            utils::ParseInteger<unsigned_int>
                      (&local_430,(uint *)&local_a68,
                       (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 4);
            local_b78._0_4_ = local_430.mCode;
            local_b70._M_p = pcVar16;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_430.mMessage._M_dataplus._M_p,
                       local_430.mMessage._M_dataplus._M_p + local_430.mMessage._M_string_length);
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
            pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            EVar1 = (pVVar11->mError).mCode;
            Value::~Value((Value *)local_b78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430.mMessage._M_dataplus._M_p != &local_430.mMessage.field_2) {
              operator_delete(local_430.mMessage._M_dataplus._M_p);
            }
            auVar15 = (undefined1  [8])local_c08._0_8_;
            if (EVar1 == kNone) {
              peVar3 = (local_be0->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x28])
                        (local_458,peVar3,local_c08,
                         (ulong)local_a68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
              local_b78._0_4_ = local_458[0];
              local_b70._M_p = pcVar16;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b70,local_450,local_448 + local_450);
              local_b50[0]._M_string_length = 0;
              local_b50[0].field_2._M_local_buf[0] = '\0';
              local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
              Value::operator=(__return_storage_ptr__,(Value *)local_b78);
              Value::~Value((Value *)local_b78);
              paVar13 = &local_440;
              goto LAB_0012cadb;
            }
          }
        }
        else {
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x27])
                    (local_480,peVar3,local_c08);
          local_b78._0_4_ = local_480[0];
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_478,local_478 + local_470);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          pBVar14 = extraout_RDX_13;
          if (local_478 != local_468) {
            operator_delete(local_478);
            pBVar14 = extraout_RDX_14;
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          if (EVar1 == kNone) {
            utils::Hex_abi_cxx11_(&local_d0,(utils *)local_c08,pBVar14);
            Value::Value((Value *)local_b78,&local_d0);
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar13 = &local_d0.field_2;
            goto LAB_0012cadb;
          }
        }
        goto LAB_0012caee;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b78 = (undefined1  [8])&local_b68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"networkname","");
      bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
      if (local_b78 != (undefined1  [8])&local_b68) {
        operator_delete((void *)local_b78);
      }
      if (bVar25) {
        auStack_bd0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auStack_bd0._8_8_ = auStack_bd0._8_8_ & 0xffffffffffffff00;
        if ((char)local_be4 == '\0') {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (0x60 < (ulong)((long)(aExpr->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
            peVar3 = (local_be0->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_bd8 = (undefined1  [8])paVar20;
            (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2a])
                      (local_4a8,peVar3,pbVar2 + 3);
            local_b78._0_4_ = local_4a8[0];
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_4a0,local_498 + local_4a0);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar12 = &local_490;
            goto LAB_0012d373;
          }
          local_bd8 = (undefined1  [8])paVar20;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_06.field_1.args_ = in_R9.args_;
          args_06.desc_ = (unsigned_long_long)local_a88;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                     args_06);
          local_8d0 = 2;
          puVar21 = local_8b8;
          local_8c8 = puVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_8c8,local_c08._0_8_,
                     (byte *)(local_c08._8_8_ + local_c08._0_8_));
          local_b78._0_4_ = local_8d0;
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_8c8,local_8c8 + local_8c0);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          puVar17 = local_8c8;
          goto LAB_0012ce9b;
        }
        peVar3 = (local_be0->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_bd8 = (undefined1  [8])paVar20;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x29])
                  (local_4d0,peVar3,local_bd8);
        local_b78._0_4_ = local_4d0[0];
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_4c8,local_4c8 + local_4c0);
        local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        EVar1 = (pVVar11->mError).mCode;
        Value::~Value((Value *)local_b78);
        if (local_4c8 != local_4b8) {
          operator_delete(local_4c8);
        }
        paVar13 = paVar20;
        auVar15 = local_bd8;
        if (EVar1 != kNone) goto LAB_0012b975;
        paVar12 = &local_7b8.field_2;
        local_7b8._M_dataplus._M_p = (pointer)paVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7b8,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8));
        Value::Value((Value *)local_b78,&local_7b8);
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        _Var18._M_p = local_7b8._M_dataplus._M_p;
LAB_0012c95e:
        paVar13 = paVar20;
        auVar15 = local_bd8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != paVar12) goto LAB_0012ceaf;
        goto LAB_0012b975;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b78 = (undefined1  [8])&local_b68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"panid","");
      bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
      if (local_b78 != (undefined1  [8])&local_b68) {
        operator_delete((void *)local_b78);
      }
      if (bVar25) {
        if ((char)local_be4 == '\0') {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_07.field_1.args_ = in_R9.args_;
            args_07.desc_ = (unsigned_long_long)local_c08;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_bd8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_07);
            local_8f8 = 2;
            paVar12 = &local_8e0;
            local_8f0 = paVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_8f0,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8))
            ;
            local_b78._0_4_ = local_8f8;
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_8f0,local_8f0->_M_local_buf + local_8e8);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            _Var18._M_p = (pointer)local_8f0;
            goto LAB_0012c95e;
          }
          utils::ParseInteger<unsigned_short>(&local_4f8,(unsigned_short *)&local_a68,pbVar2 + 3);
          local_b78._0_4_ = local_4f8.mCode;
          pcVar16 = local_b68._M_local_buf + 8;
          local_b70._M_p = pcVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_4f8.mMessage._M_dataplus._M_p,
                     local_4f8.mMessage._M_dataplus._M_p + local_4f8.mMessage._M_string_length);
          paVar13 = &local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8.mMessage._M_dataplus._M_p != &local_4f8.mMessage.field_2) {
            operator_delete(local_4f8.mMessage._M_dataplus._M_p);
          }
          if (EVar1 != kNone) {
            return __return_storage_ptr__;
          }
          utils::ParseInteger<unsigned_int>
                    (&local_520,(uint *)local_a88,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4);
          local_b78._0_4_ = local_520.mCode;
          local_b70._M_p = pcVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_520.mMessage._M_dataplus._M_p,
                     local_520.mMessage._M_dataplus._M_p + local_520.mMessage._M_string_length);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520.mMessage._M_dataplus._M_p != &local_520.mMessage.field_2) {
            operator_delete(local_520.mMessage._M_dataplus._M_p);
          }
          if (EVar1 != kNone) {
            return __return_storage_ptr__;
          }
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2c])
                    (local_548,peVar3,
                     (ulong)local_a68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffff,
                     (ulong)CONCAT22(local_a88._2_2_,local_a88._0_2_));
          local_b78._0_4_ = local_548[0];
          local_b70._M_p = pcVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_540,local_538 + local_540);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          paVar13 = &local_530;
        }
        else {
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2b])
                    (local_570,peVar3,&local_a68);
          local_b78._0_4_ = local_570[0];
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_568,local_568 + local_560);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if (local_568 != local_558) {
            operator_delete(local_568);
          }
          if (EVar1 != kNone) {
            return __return_storage_ptr__;
          }
          utils::Hex<unsigned_short>
                    (&local_f0,
                     (unsigned_short)
                     local_a68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          Value::Value((Value *)local_b78,&local_f0);
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          paVar13 = &local_f0.field_2;
        }
        goto LAB_0012b26b;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b78 = (undefined1  [8])&local_b68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"pskc","");
      bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
      if (local_b78 != (undefined1  [8])&local_b68) {
        operator_delete((void *)local_b78);
      }
      if (bVar25) {
        local_c08._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_c08._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_bf8._M_allocated_capacity = 0;
        if ((char)local_be4 == '\0') {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_08.field_1.args_ = in_R9.args_;
            args_08.desc_ = (unsigned_long_long)local_a88;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_bd8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_08);
            local_920 = 2;
            puVar21 = local_908;
            local_918 = puVar21;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_918,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8))
            ;
            local_b78._0_4_ = local_920;
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_918,local_918 + local_910);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            puVar17 = local_918;
            goto LAB_0012c7d4;
          }
          utils::Hex(&local_598,(ByteArray *)local_c08,pbVar2 + 3);
          local_b78._0_4_ = local_598.mCode;
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_598.mMessage._M_dataplus._M_p,
                     local_598.mMessage._M_dataplus._M_p + local_598.mMessage._M_string_length);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598.mMessage._M_dataplus._M_p != &local_598.mMessage.field_2) {
            operator_delete(local_598.mMessage._M_dataplus._M_p);
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          if (EVar1 == kNone) {
            peVar3 = (local_be0->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2e])
                      (local_5c0,peVar3,local_c08);
            local_b78._0_4_ = local_5c0[0];
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_5b8,local_5b0 + local_5b8);
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar13 = &local_5a8;
            goto LAB_0012cadb;
          }
        }
        else {
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2d])
                    (local_5e8,peVar3,local_c08);
          local_b78._0_4_ = local_5e8[0];
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_5e0,local_5e0 + local_5d8);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          pBVar14 = extraout_RDX_15;
          if (local_5e0 != local_5d0) {
            operator_delete(local_5e0);
            pBVar14 = extraout_RDX_16;
          }
          auVar15 = (undefined1  [8])local_c08._0_8_;
          if (EVar1 == kNone) {
            utils::Hex_abi_cxx11_(&local_110,(utils *)local_c08,pBVar14);
            Value::Value((Value *)local_b78,&local_110);
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar13 = &local_110.field_2;
            goto LAB_0012cadb;
          }
        }
      }
      else {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_b78 = (undefined1  [8])&local_b68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"securitypolicy","");
        bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
        if (local_b78 != (undefined1  [8])&local_b68) {
          operator_delete((void *)local_b78);
        }
        if (!bVar25) {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b78 = (undefined1  [8])&local_b68;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"active","");
          bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
          if (local_b78 != (undefined1  [8])&local_b68) {
            operator_delete((void *)local_b78);
          }
          if (bVar25) {
            ActiveOperationalDataset::ActiveOperationalDataset
                      ((ActiveOperationalDataset *)local_b78);
            local_a68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((char)local_be4 == '\0') {
              pbVar2 = (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(aExpr->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61)
              {
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_11.field_1.args_ = in_R9.args_;
                args_11.desc_ = (unsigned_long_long)local_a88;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11)
                           ,args_11);
                local_970 = 2;
                local_968 = local_958;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_968,local_c08._0_8_,
                           (byte *)(local_c08._8_8_ + local_c08._0_8_));
                local_bd8._0_4_ = local_970;
                auStack_bd0._0_8_ = &local_bc0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_bd0,local_968,local_968 + local_960);
                local_bb0._M_p = (pointer)local_ba0;
                local_ba8 = (pointer)0x0;
                local_ba0[0]._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
                Value::~Value((Value *)local_bd8);
                if (local_968 != local_958) {
                  operator_delete(local_968);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c08._0_8_ != paVar13) {
                  operator_delete((void *)local_c08._0_8_);
                }
              }
              else {
                ActiveDatasetFromJson(&local_6b0,(ActiveOperationalDataset *)local_b78,pbVar2 + 3);
                local_bd8._0_4_ = local_6b0.mCode;
                auStack_bd0._0_8_ = &local_bc0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_bd0,local_6b0.mMessage._M_dataplus._M_p,
                           local_6b0.mMessage._M_dataplus._M_p + local_6b0.mMessage._M_string_length
                          );
                local_ba8 = (pointer)0x0;
                local_ba0[0]._M_local_buf[0] = '\0';
                local_bb0._M_p = (pointer)local_ba0;
                pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
                EVar1 = (pVVar11->mError).mCode;
                Value::~Value((Value *)local_bd8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6b0.mMessage._M_dataplus._M_p != &local_6b0.mMessage.field_2) {
                  operator_delete(local_6b0.mMessage._M_dataplus._M_p);
                }
                if (EVar1 == kNone) {
                  peVar3 = (local_be0->
                           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr;
                  (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x32])
                            (local_6d8,peVar3,local_b78);
                  local_bd8._0_4_ = local_6d8[0][0];
                  auStack_bd0._0_8_ = &local_bc0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)auStack_bd0,local_6d0,local_6d0 + local_6c8);
                  local_ba8 = (pointer)0x0;
                  local_ba0[0]._M_local_buf[0] = '\0';
                  local_bb0._M_p = (pointer)local_ba0;
                  pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
                  EVar1 = (pVVar11->mError).mCode;
                  Value::~Value((Value *)local_bd8);
                  if (local_6d0 != local_6c0) {
                    operator_delete(local_6d0);
                  }
                  if (EVar1 == kNone) goto LAB_0012e323;
                }
              }
            }
            else {
              peVar3 = (local_be0->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x31])
                        (local_700,peVar3,local_b78,0xffff);
              local_bd8._0_4_ = local_700[0][0];
              auStack_bd0._0_8_ = &local_bc0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)auStack_bd0,local_6f8,local_6f8 + local_6f0);
              local_bb0._M_p = (pointer)local_ba0;
              local_ba8 = (pointer)0x0;
              local_ba0[0]._M_local_buf[0] = '\0';
              pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
              EVar1 = (pVVar11->mError).mCode;
              Value::~Value((Value *)local_bd8);
              aDataset = extraout_RDX_19;
              if (local_6f8 != local_6e8) {
                operator_delete(local_6f8);
                aDataset = extraout_RDX_20;
              }
              if (EVar1 == kNone) {
                ActiveDatasetToJson_abi_cxx11_(&local_150,(commissioner *)local_b78,aDataset);
                Value::Value((Value *)local_bd8,&local_150);
                Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
                Value::~Value((Value *)local_bd8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p);
                }
LAB_0012e323:
                persistent_storage::Network::Network((Network *)local_bd8);
                if (((ushort)local_aa8 >> 0xc & 1) == 0) {
                  if (((ushort)local_aa8 >> 8 & 1) != 0) {
                    utils::Hex<unsigned_short>((string *)local_c08,local_b58);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_a68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c08);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c08._0_8_ != paVar13) {
                      operator_delete((void *)local_c08._0_8_);
                    }
LAB_0012e8e2:
                    SVar8 = persistent_storage::Registry::GetNetworkXpansByAliases
                                      ((local_a28->mRegistry).
                                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,&local_a68,&local_a48,&local_9d8);
                    if ((SVar8 == kSuccess) &&
                       ((long)local_a48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_a48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start == 8)) goto LAB_0012e810;
                    ::fmt::v10::detail::
                    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_FMT_COMPILE_STRING,_0>
                              ();
                    local_bf8._M_allocated_capacity =
                         (long)local_a48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3;
                    local_c08._0_8_ =
                         ((local_a68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
                    local_c08._8_8_ =
                         (local_a68.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
                    fmt_02.size_ = 0x4d;
                    fmt_02.data_ = (char *)0x37;
                    args_14.field_1.args_ = in_R9.args_;
                    args_14.desc_ = (unsigned_long_long)local_c08;
                    ::fmt::v10::vformat_abi_cxx11_
                              ((string *)local_a88,
                               (v10 *)"Failed to load network XPAN by alias \'{}\': got {} XPANs",
                               fmt_02,args_14);
                    Console::Write((string *)local_a88,kYellow);
                    goto LAB_0012e990;
                  }
                  if (((ushort)local_aa8 >> 9 & 1) != 0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_a68,local_b50);
                    goto LAB_0012e8e2;
                  }
                  local_c08._0_8_ = paVar13;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_c08,"Dataset contains no network identification data",
                             "");
                  Console::Write((string *)local_c08,kYellow);
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c08._0_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c08._0_8_ != paVar13) goto LAB_0012e9a1;
                }
                else {
                  local_c08._0_8_ =
                       utils::Decode<unsigned_long>
                                 ((uint8_t *)local_b70._M_p,
                                  local_b68._M_allocated_capacity - (long)local_b70._M_p);
                  if (local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>
                              (&local_a48,
                               (iterator)
                               local_a48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_c08)
                    ;
                  }
                  else {
                    *local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_c08._0_8_;
                    local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
LAB_0012e810:
                  SVar8 = persistent_storage::Registry::GetNetworkByXpan
                                    ((local_a28->mRegistry).
                                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(uint64_t)
                                             ((_Alloc_hider *)
                                             local_a48.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_p,
                                     (Network *)local_bd8);
                  if (SVar8 == kSuccess) {
                    if ((local_aa8 & 0x200) == 0) {
                      local_c08._0_8_ = paVar13;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c08,anon_var_dwarf_6cd873 + 9);
                    }
                    else {
                      local_c08._0_8_ = paVar13;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_c08,local_b50[0]._M_dataplus._M_p,
                                 (long)(_func_int ***)local_b50[0]._M_string_length +
                                 local_b50[0]._M_dataplus._M_p);
                    }
                    std::__cxx11::string::operator=((string *)auStack_bd0,(string *)local_c08);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c08._0_8_ != paVar13) {
                      operator_delete((void *)local_c08._0_8_);
                    }
                    if ((local_aa8 & 0x1000) == 0) {
                      local_c08._0_8_ = (pointer)0x0;
                      local_c08._8_8_ = (pointer)0x0;
                      local_bf8._M_allocated_capacity = 0;
                      local_c08._0_8_ = operator_new(8);
                      local_c08._8_8_ = local_c08._0_8_ + 8;
                      *(size_type *)local_c08._0_8_ = 0;
                      local_bf8._M_allocated_capacity = local_c08._8_8_;
                    }
                    else {
                      local_c08._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      local_c08._8_8_ = (pointer)0x0;
                      local_bf8._M_allocated_capacity = 0;
                      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_create_storage((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         *)local_c08,
                                        local_b68._M_allocated_capacity - (long)local_b70._M_p);
                      uVar4 = local_c08._0_8_;
                      sVar22 = local_b68._M_allocated_capacity - (long)local_b70._M_p;
                      if (sVar22 != 0) {
                        memmove((void *)local_c08._0_8_,local_b70._M_p,sVar22);
                      }
                      local_c08._8_8_ = uVar4 + sVar22;
                    }
                    local_bb0._M_p =
                         (pointer)utils::Decode<unsigned_long>
                                            ((uint8_t *)local_c08._0_8_,
                                             local_c08._8_8_ - local_c08._0_8_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c08._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      operator_delete((void *)local_c08._0_8_);
                    }
                    local_ba8._0_6_ =
                         CONCAT24((ushort)((uint)(int)(short)(local_aa8 << 7) >> 0xf) & local_b58,
                                  (uint)((ushort)((uint)(int)(short)((ushort)local_aa8 * 2) >> 0xf)
                                        & local_b50[1]._M_dataplus._M_p._2_2_));
                    if ((local_aa8 >> 0xb & 1) == 0) {
                      std::__cxx11::string::operator=
                                ((string *)local_ba0[0]._M_local_buf,anon_var_dwarf_6cd873 + 9);
                    }
                    else {
                      local_9f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_9f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_9f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_create_storage(&local_9f8,(long)local_b08 - (long)local_b10);
                      puVar7 = local_9f8._M_impl.super__Vector_impl_data._M_start;
                      sVar22 = (long)local_b08 - (long)local_b10;
                      pBVar14 = extraout_RDX_23;
                      if (sVar22 != 0) {
                        memmove(local_9f8._M_impl.super__Vector_impl_data._M_start,local_b10,sVar22)
                        ;
                        pBVar14 = extraout_RDX_24;
                      }
                      local_9f8._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)((long)puVar7 + sVar22);
                      Ipv6PrefixToString_abi_cxx11_
                                ((string *)local_c08,(commissioner *)&local_9f8,pBVar14);
                      std::__cxx11::string::operator=
                                ((string *)local_ba0[0]._M_local_buf,(string *)local_c08);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c08._0_8_ != paVar13) {
                        operator_delete((void *)local_c08._0_8_);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_9f8._M_impl.super__Vector_impl_data._M_start !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        operator_delete(local_9f8._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    if (((ushort)local_aa8 & 0x40) == 0) {
                      local_c08._0_8_ = (ulong)(uint6)local_c08._2_6_ << 0x10;
                      local_a88._0_2_ = 0;
                      __l._M_len = 2;
                      __l._M_array = local_a88;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (local_c08 + 8),__l,local_188);
                    }
                    else {
                      local_c08._0_2_ = local_ac8;
                      local_c08._8_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      local_bf8._M_allocated_capacity = 0;
                      local_bf8._8_8_ = 0;
                      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_create_storage((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         *)(local_c08 + 8),(long)local_ab8 - (long)local_ac0);
                      uVar4 = local_c08._8_8_;
                      sVar22 = (long)local_ab8 - (long)local_ac0;
                      if (sVar22 != 0) {
                        memmove((void *)local_c08._8_8_,local_ac0,sVar22);
                      }
                      local_bf8._M_allocated_capacity = uVar4 + sVar22;
                    }
                    local_b80 = (uint)((*(byte *)local_c08._8_8_ & 0x20) == 0);
                    persistent_storage::Registry::Update
                              ((local_a28->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,(Network *)local_bd8);
                    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_c08._8_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c08._8_8_ ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) goto LAB_0012e9a6;
                  }
                  else {
                    ::fmt::v10::detail::
                    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
                              ();
                    utils::Hex<unsigned_long>
                              ((string *)local_a88,
                               (unsigned_long)
                               ((_Alloc_hider *)
                               local_a48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_M_p);
                    pbStack_180 = (pointer)local_a88._8_8_;
                    fmt_01.size_ = 0xd;
                    fmt_01.data_ = (char *)0x2a;
                    args_13.field_1.args_ = in_R9.args_;
                    args_13.desc_ = (unsigned_long_long)local_188;
                    ::fmt::v10::vformat_abi_cxx11_
                              ((string *)local_c08,
                               (v10 *)"Failed to find network record by XPAN \'{}\'",fmt_01,args_13)
                    ;
                    Console::Write((string *)local_c08,kYellow);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c08._0_8_ != paVar13) {
                      operator_delete((void *)local_c08._0_8_);
                    }
LAB_0012e990:
                    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_a88._4_4_,CONCAT22(local_a88._2_2_,local_a88._0_2_))
                    ;
                    if (paVar20 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_a88 + 0x10)) goto LAB_0012e9a6;
                  }
LAB_0012e9a1:
                  operator_delete(paVar20);
                }
LAB_0012e9a6:
                persistent_storage::Network::~Network((Network *)local_bd8);
              }
            }
            if ((pointer)local_a48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_9d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_a68);
            goto LAB_0012e9dc;
          }
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b78 = (undefined1  [8])&local_b68;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"pending","");
          bVar25 = CaseInsensitiveEqual(pbVar2 + 2,(string *)local_b78);
          if (local_b78 != (undefined1  [8])&local_b68) {
            operator_delete((void *)local_b78);
          }
          if (!bVar25) {
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_c08._0_8_ = pbVar2[2]._M_dataplus._M_p;
            local_c08._8_8_ = pbVar2[2]._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x2b;
            args_10.field_1.values_ = in_R9.values_;
            args_10.desc_ = (unsigned_long_long)local_c08;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_bd8,(v10 *)"{} is not a valid Operational Dataset field",
                       fmt_00,args_10);
            local_9c0 = 2;
            local_9b8 = local_9a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_9b8,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8))
            ;
            local_b78._0_4_ = local_9c0;
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_9b8,local_9b8 + local_9b0);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            if (local_9b8 != local_9a8) {
              operator_delete(local_9b8);
            }
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(auStack_bd0 + 8);
            auVar15 = local_bd8;
            goto LAB_0012b26f;
          }
          PendingOperationalDataset::PendingOperationalDataset
                    ((PendingOperationalDataset *)local_b78);
          if ((char)local_be4 == '\0') {
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (0x60 < (ulong)((long)(aExpr->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
              PendingDatasetFromJson(&local_728,(PendingOperationalDataset *)local_b78,pbVar2 + 3);
              local_bd8._0_4_ = local_728.mCode;
              auStack_bd0._0_8_ = &local_bc0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)auStack_bd0,local_728.mMessage._M_dataplus._M_p,
                         local_728.mMessage._M_dataplus._M_p + local_728.mMessage._M_string_length);
              local_ba8 = (pointer)0x0;
              local_ba0[0]._M_local_buf[0] = '\0';
              local_bb0._M_p = (pointer)local_ba0;
              pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
              EVar1 = (pVVar11->mError).mCode;
              Value::~Value((Value *)local_bd8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_728.mMessage._M_dataplus._M_p != &local_728.mMessage.field_2) {
                operator_delete(local_728.mMessage._M_dataplus._M_p);
              }
              if (EVar1 != kNone) goto LAB_0012e9dc;
              peVar3 = (local_be0->
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x34])
                        (local_750,peVar3,local_b78);
              local_bd8._0_4_ = local_750[0][0];
              auStack_bd0._0_8_ = &local_bc0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)auStack_bd0,local_748,local_740 + local_748);
              local_ba8 = (pointer)0x0;
              local_ba0[0]._M_local_buf[0] = '\0';
              local_bb0._M_p = (pointer)local_ba0;
              Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
              Value::~Value((Value *)local_bd8);
              paVar13 = &local_738;
              goto LAB_0012e682;
            }
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_12.field_1.values_ = in_R9.values_;
            args_12.desc_ = (unsigned_long_long)local_a88;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_12);
            local_998 = 2;
            local_990 = local_980;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_990,local_c08._0_8_,
                       (byte *)(local_c08._8_8_ + local_c08._0_8_));
            local_bd8._0_4_ = local_998;
            auStack_bd0._0_8_ = &local_bc0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_bd0,local_990,local_990 + local_988);
            local_bb0._M_p = (pointer)local_ba0;
            local_ba8 = (pointer)0x0;
            local_ba0[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
            Value::~Value((Value *)local_bd8);
            if (local_990 != local_980) {
              operator_delete(local_990);
            }
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c08._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c08._0_8_ == paVar13) goto LAB_0012e9dc;
          }
          else {
            peVar3 = (local_be0->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x33])
                      (local_778,peVar3,local_b78,0xffff);
            local_bd8._0_4_ = local_778[0][0];
            auStack_bd0._0_8_ = &local_bc0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_bd0,local_770,local_770 + local_768);
            local_bb0._M_p = (pointer)local_ba0;
            local_ba8 = (pointer)0x0;
            local_ba0[0]._M_local_buf[0] = '\0';
            pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
            EVar1 = (pVVar11->mError).mCode;
            Value::~Value((Value *)local_bd8);
            aDataset_00 = extraout_RDX_21;
            if (local_770 != local_760) {
              operator_delete(local_770);
              aDataset_00 = extraout_RDX_22;
            }
            if (EVar1 != kNone) goto LAB_0012e9dc;
            PendingDatasetToJson_abi_cxx11_(&local_170,(commissioner *)local_b78,aDataset_00);
            Value::Value((Value *)local_bd8,&local_170);
            Value::operator=(__return_storage_ptr__,(Value *)local_bd8);
            Value::~Value((Value *)local_bd8);
            paVar13 = &local_170.field_2;
LAB_0012e682:
            paVar20 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(paVar13->_M_local_buf + -0x10);
            if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(paVar13->_M_local_buf + -0x10) == paVar13) goto LAB_0012e9dc;
          }
          operator_delete(paVar20);
LAB_0012e9dc:
          ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_b78)
          ;
          return __return_storage_ptr__;
        }
        auStack_bd0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auStack_bd0._8_8_ = 0;
        local_bc0._0_8_ = 0;
        if ((char)local_be4 == '\0') {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_09.field_1.args_ = in_R9.args_;
            args_09.desc_ = (unsigned_long_long)local_a88;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_09);
            local_948 = 2;
            local_940 = local_930;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_940,local_c08._0_8_,
                       (byte *)(local_c08._8_8_ + local_c08._0_8_));
            local_b78._0_4_ = local_948;
            local_b70._M_p = local_b68._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_940,local_940 + local_938);
            local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            if (local_940 != local_930) {
              operator_delete(local_940);
            }
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c08._0_8_;
            auVar15 = (undefined1  [8])auStack_bd0._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c08._0_8_ != paVar13) goto LAB_0012e1cd;
          }
          else {
            utils::ParseInteger<unsigned_short>(&local_610,(unsigned_short *)local_bd8,pbVar2 + 3);
            local_b78._0_4_ = local_610.mCode;
            pcVar16 = local_b68._M_local_buf + 8;
            local_b70._M_p = pcVar16;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b70,local_610.mMessage._M_dataplus._M_p,
                       local_610.mMessage._M_dataplus._M_p + local_610.mMessage._M_string_length);
            paVar13 = &local_b50[0].field_2;
            local_b50[0]._M_string_length = 0;
            local_b50[0].field_2._M_local_buf[0] = '\0';
            local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
            pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            EVar1 = (pVVar11->mError).mCode;
            Value::~Value((Value *)local_b78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_610.mMessage._M_dataplus._M_p != &local_610.mMessage.field_2) {
              operator_delete(local_610.mMessage._M_dataplus._M_p);
            }
            auVar15 = (undefined1  [8])auStack_bd0._0_8_;
            if (EVar1 == kNone) {
              utils::Hex(&local_638,(ByteArray *)auStack_bd0,
                         (aExpr->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 4);
              local_b78._0_4_ = local_638.mCode;
              local_b70._M_p = pcVar16;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b70,local_638.mMessage._M_dataplus._M_p,
                         local_638.mMessage._M_dataplus._M_p + local_638.mMessage._M_string_length);
              local_b50[0]._M_string_length = 0;
              local_b50[0].field_2._M_local_buf[0] = '\0';
              local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
              pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
              EVar1 = (pVVar11->mError).mCode;
              Value::~Value((Value *)local_b78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638.mMessage._M_dataplus._M_p != &local_638.mMessage.field_2) {
                operator_delete(local_638.mMessage._M_dataplus._M_p);
              }
              auVar15 = (undefined1  [8])auStack_bd0._0_8_;
              if (EVar1 == kNone) {
                peVar3 = (local_be0->
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x30])
                          (local_660,peVar3,local_bd8);
                local_b78._0_4_ = local_660[0];
                local_b70._M_p = pcVar16;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b70,local_658,local_650 + local_658);
                local_b50[0]._M_string_length = 0;
                local_b50[0].field_2._M_local_buf[0] = '\0';
                local_b50[0]._M_dataplus._M_p = (pointer)paVar13;
                Value::operator=(__return_storage_ptr__,(Value *)local_b78);
                Value::~Value((Value *)local_b78);
                paVar13 = &local_648;
                goto LAB_0012d91e;
              }
            }
          }
        }
        else {
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x2f])
                    (local_688,peVar3,local_bd8);
          local_b78._0_4_ = local_688[0];
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_680,local_680 + local_678);
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          EVar1 = (pVVar11->mError).mCode;
          Value::~Value((Value *)local_b78);
          aSecurityPolicy = extraout_RDX_17;
          if (local_680 != local_670) {
            operator_delete(local_680);
            aSecurityPolicy = extraout_RDX_18;
          }
          auVar15 = (undefined1  [8])auStack_bd0._0_8_;
          if (EVar1 == kNone) {
            ToString_abi_cxx11_(&local_130,(Interpreter *)local_bd8,aSecurityPolicy);
            Value::Value((Value *)local_b78,&local_130);
            Value::operator=(__return_storage_ptr__,(Value *)local_b78);
            Value::~Value((Value *)local_b78);
            paVar13 = &local_130.field_2;
LAB_0012d91e:
            paVar20 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(paVar13->_M_local_buf + -0x10);
            auVar15 = (undefined1  [8])auStack_bd0._0_8_;
            if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(paVar13->_M_local_buf + -0x10) != paVar13) {
LAB_0012e1cd:
              operator_delete(paVar20);
              auVar15 = (undefined1  [8])auStack_bd0._0_8_;
            }
          }
        }
      }
LAB_0012caee:
      if (auVar15 == (undefined1  [8])0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_0012b97a;
    }
    auStack_bd0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auStack_bd0._8_8_ = auStack_bd0._8_8_ & 0xffffffffffffff00;
    if ((char)local_be4 == '\0') {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
        local_bd8 = (undefined1  [8])paVar20;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_04.field_1.args_ = in_R9.args_;
        args_04.desc_ = (unsigned_long_long)local_a88;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_c08,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_04
                  );
        local_880 = 2;
        puVar21 = local_868;
        local_878 = puVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_878,local_c08._0_8_,(byte *)(local_c08._8_8_ + local_c08._0_8_))
        ;
        local_b78._0_4_ = local_880;
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_878,local_878 + local_870);
        local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        puVar17 = local_878;
LAB_0012ce9b:
        if (puVar17 != puVar21) {
          operator_delete(puVar17);
        }
        bVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c08._0_8_ != paVar13;
        paVar13 = paVar20;
        _Var18._M_p = (pointer)local_c08._0_8_;
        auVar15 = local_bd8;
        if (bVar25) {
LAB_0012ceaf:
          operator_delete(_Var18._M_p);
          paVar13 = paVar20;
          auVar15 = local_bd8;
        }
      }
      else {
        local_bd8 = (undefined1  [8])paVar20;
        utils::ParseInteger<unsigned_int>(&local_390,(uint *)&local_a68,pbVar2 + 4);
        local_b78._0_4_ = local_390.mCode;
        local_b70._M_p = local_b68._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b70,local_390.mMessage._M_dataplus._M_p,
                   local_390.mMessage._M_dataplus._M_p + local_390.mMessage._M_string_length);
        local_b50[0]._M_string_length = 0;
        local_b50[0].field_2._M_local_buf[0] = '\0';
        local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
        pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        EVar1 = (pVVar11->mError).mCode;
        Value::~Value((Value *)local_b78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390.mMessage._M_dataplus._M_p != &local_390.mMessage.field_2) {
          operator_delete(local_390.mMessage._M_dataplus._M_p);
        }
        paVar13 = paVar20;
        auVar15 = local_bd8;
        if (EVar1 == kNone) {
          peVar3 = (local_be0->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x25])
                    (local_3b8,peVar3,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 3,
                     (ulong)local_a68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
          local_b78._0_4_ = local_3b8[0];
          local_b70._M_p = local_b68._M_local_buf + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b70,local_3b0,local_3a8 + local_3b0);
          local_b50[0]._M_string_length = 0;
          local_b50[0].field_2._M_local_buf[0] = '\0';
          local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
          Value::operator=(__return_storage_ptr__,(Value *)local_b78);
          Value::~Value((Value *)local_b78);
          paVar12 = &local_3a0;
LAB_0012d373:
          paVar13 = paVar20;
          _Var18._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   **)(paVar12->_M_local_buf + -0x10);
          auVar15 = local_bd8;
          if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(paVar12->_M_local_buf + -0x10) != paVar12) goto LAB_0012ceaf;
        }
      }
    }
    else {
      peVar3 = (local_be0->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_bd8 = (undefined1  [8])paVar20;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x24])
                (local_3e0,peVar3,local_bd8);
      local_b78._0_4_ = local_3e0[0];
      local_b70._M_p = local_b68._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b70,local_3d8,local_3d8 + local_3d0);
      local_b50[0]._M_dataplus._M_p = (pointer)&local_b50[0].field_2;
      local_b50[0]._M_string_length = 0;
      local_b50[0].field_2._M_local_buf[0] = '\0';
      pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_b78);
      EVar1 = (pVVar11->mError).mCode;
      Value::~Value((Value *)local_b78);
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      paVar13 = paVar20;
      auVar15 = local_bd8;
      if (EVar1 == kNone) {
        paVar12 = &local_798.field_2;
        local_798._M_dataplus._M_p = (pointer)paVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_798,local_bd8,(byte *)(auStack_bd0._0_8_ + (long)local_bd8));
        Value::Value((Value *)local_b78,&local_798);
        Value::operator=(__return_storage_ptr__,(Value *)local_b78);
        Value::~Value((Value *)local_b78);
        _Var18._M_p = local_798._M_dataplus._M_p;
        goto LAB_0012c95e;
      }
    }
  }
LAB_0012b975:
  if (auVar15 == (undefined1  [8])paVar13) {
    return __return_storage_ptr__;
  }
LAB_0012b97a:
  operator_delete((void *)auVar15);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessOpDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (CaseInsensitiveEqual(aExpr[2], "activetimestamp"))
    {
        Timestamp activeTimestamp;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set activetimestamp"));
        SuccessOrExit(value = aCommissioner->GetActiveTimestamp(activeTimestamp));
        value = ToString(activeTimestamp);
    }
    else if (CaseInsensitiveEqual(aExpr[2], "channel"))
    {
        Channel channel;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 6, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(channel.mPage, aExpr[3]));
            SuccessOrExit(value = ParseInteger(channel.mNumber, aExpr[4]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[5]));
            SuccessOrExit(value = aCommissioner->SetChannel(channel, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetChannel(channel));
            value = ToString(channel);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "channelmask"))
    {
        ChannelMask channelMask;
        if (isSet)
        {
            SuccessOrExit(value = ParseChannelMask(channelMask, aExpr, 3));
            SuccessOrExit(value = aCommissioner->SetChannelMask(channelMask));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetChannelMask(channelMask));
            value = ToString(channelMask);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "xpanid"))
    {
        ByteArray xpanid;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(xpanid, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetExtendedPanId(xpanid));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetExtendedPanId(xpanid));
            value = utils::Hex(xpanid);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "meshlocalprefix"))
    {
        std::string prefix;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetMeshLocalPrefix(aExpr[3], CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetMeshLocalPrefix(prefix));
            value = prefix;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "networkmasterkey"))
    {
        ByteArray masterKey;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(masterKey, aExpr[3]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetNetworkMasterKey(masterKey, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetNetworkMasterKey(masterKey));
            value = utils::Hex(masterKey);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "networkname"))
    {
        std::string networkName;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetNetworkName(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetNetworkName(networkName));
            value = networkName;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "panid"))
    {
        uint16_t panid;
        if (isSet)
        {
            uint32_t delay;
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(panid, aExpr[3]));
            SuccessOrExit(value = ParseInteger(delay, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetPanId(panid, CommissionerApp::MilliSeconds(delay)));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPanId(panid));
            value = Hex(panid);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "pskc"))
    {
        ByteArray pskc;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = utils::Hex(pskc, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetPSKc(pskc));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPSKc(pskc));
            value = utils::Hex(pskc);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "securitypolicy"))
    {
        SecurityPolicy policy;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ParseInteger(policy.mRotationTime, aExpr[3]));
            SuccessOrExit(value = utils::Hex(policy.mFlags, aExpr[4]));
            SuccessOrExit(value = aCommissioner->SetSecurityPolicy(policy));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetSecurityPolicy(policy));
            value = ToString(policy);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "active"))
    {
        ActiveOperationalDataset dataset;
        StringArray              nwkAliases;
        StringArray              unresolved;
        std::vector<uint64_t>    xpans;

        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = ActiveDatasetFromJson(dataset, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetActiveDataset(dataset));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetActiveDataset(dataset, 0xFFFF));
            value = ActiveDatasetToJson(dataset);
        }
        // Update network from active opdataset (no error there, log messages only)
        do
        {
            Network nwk;
            // Get network object for the opdataset object
            if ((dataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit) != 0)
            {
                xpans.push_back(utils::Decode<uint64_t>(dataset.mExtendedPanId));
            }
            else
            {
                if ((dataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) != 0)
                {
                    nwkAliases.push_back(Hex(dataset.mPanId));
                }
                else if ((dataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit) != 0)
                {
                    nwkAliases.push_back(dataset.mNetworkName);
                }
                else
                {
                    Console::Write("Dataset contains no network identification data", Console::Color::kYellow);
                    break;
                }
                if (mRegistry->GetNetworkXpansByAliases(nwkAliases, xpans, unresolved) != RegistryStatus::kSuccess ||
                    xpans.size() != 1)
                {
                    Console::Write(fmt::format(FMT_STRING("Failed to load network XPAN by alias '{}': got {} XPANs"),
                                               nwkAliases[0], xpans.size()),
                                   Console::Color::kYellow);
                    break;
                }
            }
            if (mRegistry->GetNetworkByXpan(xpans[0], nwk) != RegistryStatus::kSuccess)
            {
                Console::Write(
                    fmt::format(FMT_STRING("Failed to find network record by XPAN '{}'"), utils::Hex(xpans[0])),
                    Console::Color::kYellow);
                break; /// @todo It is possible that network XPAN ID
                       ///       might have change since the last sync
                       ///       so maybe it is worth to look up for
                       ///       the network by name or PAN ID as well
                       ///       to apply the change
            }

// Update network object
#define AODS_FIELD_IF_IS_SET(field, defaultValue) \
    (((dataset.mPresentFlags & ActiveOperationalDataset::k##field##Bit) == 0) ? (defaultValue) : (dataset.m##field))

            nwk.mName = AODS_FIELD_IF_IS_SET(NetworkName, "");
            nwk.mXpan =
                utils::Decode<uint64_t>(AODS_FIELD_IF_IS_SET(ExtendedPanId, ByteArray(kExtendedPanIdLength, 0)));
            nwk.mChannel = AODS_FIELD_IF_IS_SET(Channel, (Channel{0, 0})).mNumber;
            nwk.mPan     = AODS_FIELD_IF_IS_SET(PanId, 0);
            if ((dataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit) == 0)
            {
                nwk.mPan = 0;
            }
            else
            {
                nwk.mPan = dataset.mPanId;
            }

            if ((dataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit) == 0)
            {
                nwk.mMlp = "";
            }
            else
            {
                nwk.mMlp = Ipv6PrefixToString(dataset.mMeshLocalPrefix);
            }

            SecurityPolicy sp = AODS_FIELD_IF_IS_SET(SecurityPolicy, (SecurityPolicy{0, ByteArray{0, 0}}));
            nwk.mCcm          = !(sp.mFlags[0] & kSecurityPolicyBit_CCM);
#undef AODS_FIELD_IF_IS_SET
            // Store network object in the registry
            mRegistry->Update(nwk);
        } while (false);
    }
    else if (CaseInsensitiveEqual(aExpr[2], "pending"))
    {
        PendingOperationalDataset dataset;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = PendingDatasetFromJson(dataset, aExpr[3]));
            SuccessOrExit(value = aCommissioner->SetPendingDataset(dataset));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetPendingDataset(dataset, 0xFFFF));
            value = PendingDatasetToJson(dataset);
        }
    }
    else
    {
        value = ERROR_INVALID_ARGS("{} is not a valid Operational Dataset field", aExpr[2]);
    }

exit:
    return value;
}